

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::http_parser::header_abi_cxx11_(http_parser *this,string_view key)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  http_parser *this_local;
  string_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (http_parser *)key._M_len;
  i._M_node = (_Base_ptr)this;
  if (header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)
                                 ::empty_abi_cxx11_);
    if (iVar2 != 0) {
      ::std::__cxx11::string::string
                ((string *)
                 &header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::
                  empty_abi_cxx11_);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::
                    empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::
                           empty_abi_cxx11_);
    }
  }
  local_30._M_node =
       (_Base_ptr)
       ::std::
       multimap<std::__cxx11::string,std::__cxx11::string,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
       ::find<std::basic_string_view<char,std::char_traits<char>>>
                 ((multimap<std::__cxx11::string,std::__cxx11::string,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   *)&this->m_header,(basic_string_view<char,_std::char_traits<char>_> *)&this_local
                 );
  local_38._M_node =
       (_Base_ptr)
       ::std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_header);
  bVar1 = ::std::operator==(&local_30,&local_38);
  if (bVar1) {
    key_local._M_str =
         (char *)&header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::
                  empty_abi_cxx11_;
  }
  else {
    ppVar3 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    key_local._M_str = (char *)&ppVar3->second;
  }
  return (string *)key_local._M_str;
}

Assistant:

std::string const& http_parser::header(string_view const key) const
	{
		static std::string const empty;
		// at least GCC-5.4 for ARM (on travis) has a libstdc++ whose debug map$
		// doesn't seem to support transparent comparators$
#if ! defined _GLIBCXX_DEBUG
		auto const i = m_header.find(key);
#else
		auto const i = m_header.find(std::string(key));
#endif
		if (i == m_header.end()) return empty;
		return i->second;
	}